

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

ostream * pstore::operator<<(ostream *os,address *addr)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"{s:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)(addr->a_ >> 0x16));
  poVar1 = std::operator<<(poVar1," +:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"}");
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, address const & addr) {
        return os << "{s:" << addr.segment () << " +:" << addr.offset () << "}";
    }